

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.h
# Opt level: O2

void __thiscall
Refal2::COperationsExecuter::macthLeftMaxByQualifierSaveToTable_E
          (COperationsExecuter *this,TQualifierIndex qualifier)

{
  CUnitNode *pCVar1;
  bool bVar2;
  CUnitNode *nodeB;
  CNode<Refal2::CUnit> *pCVar3;
  
  pCVar1 = this->left;
  while( true ) {
    bVar2 = isEmpty(this);
    if (bVar2) break;
    bVar2 = checkQualifier(this,this->left->next,qualifier);
    if (!bVar2) break;
    pCVar3 = this->left->next;
    this->left = pCVar3;
    if (((pCVar3->super_CUnit).type & UT_LeftParen) != 0) {
      this->left = (CUnitNode *)(pCVar3->super_CUnit).field_1;
    }
  }
  nodeB = this->left;
  if (nodeB == pCVar1) {
    pCVar3 = (CUnitNode *)0x0;
    nodeB = (CUnitNode *)0x0;
  }
  else {
    pCVar3 = pCVar1->next;
  }
  saveToTable(this,pCVar3,nodeB);
  return;
}

Assistant:

inline void COperationsExecuter::macthLeftMaxByQualifierSaveToTable_E(
	const TQualifierIndex qualifier )
{
	CUnitNode* first = left;
	while( !isEmpty() && checkQualifier( left->Next(), qualifier ) ) {
		left = left->Next();
		if( left->IsLeftParen() ) {
			left = left->PairedParen();
		}
	}
	if( left == first ) {
		saveToTable( 0, 0 );
	} else {
		saveToTable( first->Next(), left );
	}
}